

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_connect(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  int iVar1;
  CURLcode CVar2;
  tftp_state_data_t *state;
  uchar *puVar3;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  
  state = (tftp_state_data_t *)(*Curl_ccalloc)(1,0x170);
  (conn->proto).tftpc = state;
  if (state == (tftp_state_data_t *)0x0) {
LAB_0012e60b:
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    lVar6 = (conn->data->set).tftp_blksize;
    if (lVar6 == 0) {
      lVar6 = 0x200;
    }
    else if ((int)lVar6 - 0xffb9U < 0xffff004f) {
      return CURLE_TFTP_ILLEGAL;
    }
    if ((state->rpacket).data == (uchar *)0x0) {
      puVar3 = (uchar *)(*Curl_ccalloc)(1,(long)lVar6 + 4);
      (state->rpacket).data = puVar3;
      if (puVar3 == (uchar *)0x0) goto LAB_0012e60b;
    }
    if ((state->spacket).data == (uchar *)0x0) {
      puVar3 = (uchar *)(*Curl_ccalloc)(1,(long)lVar6 + 4);
      (state->spacket).data = puVar3;
      if (puVar3 == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    Curl_conncontrol(conn,1);
    state->conn = conn;
    state->sockfd = conn->sock[0];
    state->state = TFTP_STATE_START;
    state->error = TFTP_ERR_NONE;
    state->blksize = 0x200;
    state->requested_blksize = (int)lVar6;
    (state->local_addr).buffer.sa.sa_family = (sa_family_t)conn->ip_addr->ai_family;
    tftp_set_timeouts(state);
    if ((conn->bits).bound == false) {
      iVar1 = bind(state->sockfd,(sockaddr *)&state->local_addr,conn->ip_addr->ai_addrlen);
      if (iVar1 != 0) {
        data = conn->data;
        piVar4 = __errno_location();
        pcVar5 = Curl_strerror(conn,*piVar4);
        Curl_failf(data,"bind() failed; %s",pcVar5);
        return CURLE_COULDNT_CONNECT;
      }
      (conn->bits).bound = true;
    }
    Curl_pgrsStartNow(conn->data);
    *done = true;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode tftp_connect(struct connectdata *conn, bool *done)
{
  tftp_state_data_t *state;
  int blksize;

  blksize = TFTP_BLKSIZE_DEFAULT;

  state = conn->proto.tftpc = calloc(1, sizeof(tftp_state_data_t));
  if(!state)
    return CURLE_OUT_OF_MEMORY;

  /* alloc pkt buffers based on specified blksize */
  if(conn->data->set.tftp_blksize) {
    blksize = (int)conn->data->set.tftp_blksize;
    if(blksize > TFTP_BLKSIZE_MAX || blksize < TFTP_BLKSIZE_MIN)
      return CURLE_TFTP_ILLEGAL;
  }

  if(!state->rpacket.data) {
    state->rpacket.data = calloc(1, blksize + 2 + 2);

    if(!state->rpacket.data)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!state->spacket.data) {
    state->spacket.data = calloc(1, blksize + 2 + 2);

    if(!state->spacket.data)
      return CURLE_OUT_OF_MEMORY;
  }

  /* we don't keep TFTP connections up basically because there's none or very
   * little gain for UDP */
  connclose(conn, "TFTP");

  state->conn = conn;
  state->sockfd = state->conn->sock[FIRSTSOCKET];
  state->state = TFTP_STATE_START;
  state->error = TFTP_ERR_NONE;
  state->blksize = TFTP_BLKSIZE_DEFAULT;
  state->requested_blksize = blksize;

  ((struct sockaddr *)&state->local_addr)->sa_family =
    (CURL_SA_FAMILY_T)(conn->ip_addr->ai_family);

  tftp_set_timeouts(state);

  if(!conn->bits.bound) {
    /* If not already bound, bind to any interface, random UDP port. If it is
     * reused or a custom local port was desired, this has already been done!
     *
     * We once used the size of the local_addr struct as the third argument
     * for bind() to better work with IPv6 or whatever size the struct could
     * have, but we learned that at least Tru64, AIX and IRIX *requires* the
     * size of that argument to match the exact size of a 'sockaddr_in' struct
     * when running IPv4-only.
     *
     * Therefore we use the size from the address we connected to, which we
     * assume uses the same IP version and thus hopefully this works for both
     * IPv4 and IPv6...
     */
    int rc = bind(state->sockfd, (struct sockaddr *)&state->local_addr,
                  conn->ip_addr->ai_addrlen);
    if(rc) {
      failf(conn->data, "bind() failed; %s",
            Curl_strerror(conn, SOCKERRNO));
      return CURLE_COULDNT_CONNECT;
    }
    conn->bits.bound = TRUE;
  }

  Curl_pgrsStartNow(conn->data);

  *done = TRUE;

  return CURLE_OK;
}